

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

bool pugi::impl::(anonymous_namespace)::strcpy_insitu<char*,unsigned_long>
               (char **dest,unsigned_long *header,uintptr_t header_mask,char_t *source,
               size_t source_length)

{
  char *__s;
  xml_allocator *this;
  size_t sVar1;
  undefined2 *puVar2;
  ulong uVar3;
  undefined2 uVar4;
  xml_memory_page *page;
  int local_38 [2];
  
  if (source_length == 0) {
    uVar3 = *header;
    if ((uVar3 & header_mask) != 0) {
      anon_unknown_0::xml_allocator::deallocate_string
                (*(xml_allocator **)((long)header - (uVar3 >> 8)),*dest);
      uVar3 = *header;
    }
    *dest = (char *)0x0;
    *header = ~header_mask & uVar3;
    return true;
  }
  __s = *dest;
  uVar3 = *header;
  if ((uVar3 & 0x40) == 0 && __s != (char *)0x0) {
    sVar1 = strlen(__s);
    if ((uVar3 & header_mask) == 0) {
      if (source_length <= sVar1) goto LAB_006887d8;
    }
    else if ((source_length <= sVar1) && ((sVar1 < 0x20 || (sVar1 - source_length < sVar1 >> 1)))) {
LAB_006887d8:
      memcpy(__s,source,source_length);
      (*dest)[source_length] = '\0';
      return true;
    }
  }
  this = *(xml_allocator **)((long)header - (uVar3 >> 8));
  uVar3 = source_length + 0xc;
  puVar2 = (undefined2 *)
           anon_unknown_0::xml_allocator::allocate_memory
                     (this,uVar3 & 0xfffffffffffffff8,(xml_memory_page **)local_38);
  if (puVar2 != (undefined2 *)0x0) {
    *puVar2 = (short)(((int)puVar2 - local_38[0]) + 0x7ffd8U >> 3);
    uVar4 = 0;
    if (uVar3 < 0x80000) {
      uVar4 = (short)(uVar3 >> 3);
    }
    puVar2[1] = uVar4;
    memcpy(puVar2 + 2,source,source_length);
    *(undefined1 *)((long)puVar2 + source_length + 4) = 0;
    uVar3 = *header;
    if ((uVar3 & header_mask) != 0) {
      anon_unknown_0::xml_allocator::deallocate_string(this,*dest);
      uVar3 = *header;
    }
    *dest = (char *)(puVar2 + 2);
    *header = uVar3 | header_mask;
    return true;
  }
  return false;
}

Assistant:

PUGI_IMPL_FN bool strcpy_insitu(String& dest, Header& header, uintptr_t header_mask, const char_t* source, size_t source_length)
	{
		assert((header & header_mask) == 0 || dest); // header bit indicates whether dest was previously allocated

		if (source_length == 0)
		{
			// empty string and null pointer are equivalent, so just deallocate old memory
			xml_allocator* alloc = PUGI_IMPL_GETPAGE_IMPL(header)->allocator;

			if (header & header_mask) alloc->deallocate_string(dest);

			// mark the string as not allocated
			dest = NULL;
			header &= ~header_mask;

			return true;
		}
		else if (dest && strcpy_insitu_allow(source_length, header, header_mask, dest))
		{
			// we can reuse old buffer, so just copy the new data (including zero terminator)
			memcpy(dest, source, source_length * sizeof(char_t));
			dest[source_length] = 0;

			return true;
		}
		else
		{
			xml_allocator* alloc = PUGI_IMPL_GETPAGE_IMPL(header)->allocator;

			if (!alloc->reserve()) return false;

			// allocate new buffer
			char_t* buf = alloc->allocate_string(source_length + 1);
			if (!buf) return false;

			// copy the string (including zero terminator)
			memcpy(buf, source, source_length * sizeof(char_t));
			buf[source_length] = 0;

			// deallocate old buffer (*after* the above to protect against overlapping memory and/or allocation failures)
			if (header & header_mask) alloc->deallocate_string(dest);

			// the string is now allocated, so set the flag
			dest = buf;
			header |= header_mask;

			return true;
		}
	}